

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O0

string * helics::fileops::tomlAsString_abi_cxx11_(value *element)

{
  value_t vVar1;
  basic_value<toml::type_config> *in_RSI;
  string *in_RDI;
  ostringstream str;
  ostringstream local_190 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  long in_stack_fffffffffffffe98;
  basic_value<toml::type_config> *in_stack_fffffffffffffeb8;
  ostream *in_stack_fffffffffffffec0;
  nothrow_t local_13;
  nothrow_t local_12;
  nothrow_t local_11;
  basic_value<toml::type_config> *local_10;
  
  local_10 = in_RSI;
  vVar1 = toml::basic_value<toml::type_config>::type(in_RSI);
  if (vVar1 == integer) {
    toml::basic_value<toml::type_config>::as_integer(local_10,&local_13);
    CLI::std::__cxx11::to_string(in_stack_fffffffffffffe98);
  }
  else if (vVar1 == floating) {
    toml::basic_value<toml::type_config>::as_floating(local_10,&local_12);
    std::__cxx11::to_string((double)in_RDI);
  }
  else if (vVar1 == string) {
    toml::basic_value<toml::type_config>::as_string_abi_cxx11_(local_10,&local_11);
    std::__cxx11::string::string(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_190);
    toml::operator<<(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return in_RDI;
}

Assistant:

std::string tomlAsString(const toml::value& element)
{
    switch (element.type()) {
        case toml::value_t::string:
            return element.as_string(std::nothrow_t());  // NOLINT
        case toml::value_t::floating:
            return std::to_string(element.as_floating(std::nothrow_t()));
        case toml::value_t::integer:
            return std::to_string(element.as_integer(std::nothrow_t()));
        default: {
            std::ostringstream str;
            str << element;
            return str.str();
        }
    }
}